

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O2

void __thiscall CDirectiveData::writeSymData(CDirectiveData *this,SymbolData *symData)

{
  size_t sVar1;
  DataType DStack_8;
  
  if (this->ascii == false) {
    sVar1 = this->UnitSize;
    if (sVar1 == 1) {
      DStack_8 = Data8;
    }
    else if (sVar1 == 4) {
      DStack_8 = Data32;
    }
    else {
      if (sVar1 != 2) {
        return;
      }
      DStack_8 = Data16;
    }
  }
  else {
    DStack_8 = DataAscii;
  }
  SymbolData::addData(symData,this->RamPos,this->SpaceNeeded,DStack_8);
  return;
}

Assistant:

void CDirectiveData::writeSymData(SymbolData& symData)
{
	if (ascii == true)
	{
		symData.addData(RamPos,SpaceNeeded,SymbolData::DataAscii);
	} else {
		switch (UnitSize)
		{
		case 1:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data8);
			break;
		case 2:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data16);
			break;
		case 4:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data32);
			break;
		}
	}
}